

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzread(BZFILE *b,void *buf,int len)

{
  int local_28;
  int nread;
  int bzerr;
  int len_local;
  void *buf_local;
  BZFILE *b_local;
  
  if (*(int *)((long)b + 0x13e8) == 4) {
    b_local._4_4_ = 0;
  }
  else {
    nread = len;
    _bzerr = buf;
    buf_local = b;
    b_local._4_4_ = BZ2_bzRead(&local_28,b,buf,len);
    if ((local_28 != 0) && (local_28 != 4)) {
      b_local._4_4_ = -1;
    }
  }
  return b_local._4_4_;
}

Assistant:

int BZ2_bzread (BZFILE* b, void* buf, int len )
{
   int bzerr, nread;
   if (((bzFile*)b)->lastErr == BZ_STREAM_END) return 0;
   nread = BZ2_bzRead(&bzerr,b,buf,len);
   if (bzerr == BZ_OK || bzerr == BZ_STREAM_END) {
      return nread;
   } else {
      return -1;
   }
}